

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom.cpp
# Opt level: O3

void __thiscall md::ROM::update_checksum(ROM *this)

{
  pointer puVar1;
  ulong uVar2;
  uint16_t word;
  uint uVar3;
  ulong uVar4;
  
  puVar1 = (this->_byte_array).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(this->_byte_array).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (uVar2 < 0x201) {
    word = 0;
  }
  else {
    uVar4 = 0x200;
    uVar3 = 0x202;
    word = 0;
    do {
      word = word + CONCAT11(puVar1[uVar4],puVar1[uVar3 - 1]);
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 + 2;
    } while (uVar4 < uVar2);
  }
  set_word(this,0x18e,word);
  return;
}

Assistant:

void ROM::update_checksum()
{
    uint16_t checksum = 0;
    for (uint32_t addr = 0x200; addr < _byte_array.size(); addr += 0x02)
    {
        uint8_t msb = _byte_array[addr];
        uint8_t lsb = _byte_array[addr + 1];
        uint16_t word = (uint16_t)(msb << 8) | lsb;
        checksum += word;
    }

    this->set_word(0x18E, checksum);
}